

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

parse_error *
nlohmann::detail::parse_error::
create<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (int id_,position_t *pos,string *what_arg,
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *context)

{
  size_t *in_RDX;
  undefined4 in_ESI;
  parse_error *in_RDI;
  string w;
  undefined4 in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  size_t byte_;
  int id__00;
  parse_error *this;
  string local_160 [8];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  string local_140 [55];
  allocator local_109;
  string local_108 [32];
  position_t *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff24;
  string *in_stack_ffffffffffffff28;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [48];
  size_t *local_18;
  undefined4 local_c;
  
  this = in_RDI;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"parse_error",&local_109);
  exception::name(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)in_stack_fffffffffffffe80);
  position_string_abi_cxx11_(in_stack_ffffffffffffff18);
  std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)in_stack_fffffffffffffe80);
  exception::
  diagnostics<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (in_stack_fffffffffffffea8);
  std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_fffffffffffffe80);
  id__00 = (int)((ulong)in_RDI >> 0x20);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  byte_ = *local_18;
  std::__cxx11::string::c_str();
  parse_error(this,id__00,byte_,(char *)CONCAT44(local_c,in_stack_fffffffffffffe78));
  std::__cxx11::string::~string(local_48);
  return this;
}

Assistant:

static parse_error create(int id_, const position_t& pos, const std::string& what_arg, const BasicJsonType& context)
    {
        std::string w = exception::name("parse_error", id_) + "parse error" +
                        position_string(pos) + ": " + exception::diagnostics(context) + what_arg;
        return {id_, pos.chars_read_total, w.c_str()};
    }